

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# system.c
# Opt level: O0

int64 time_freq(void)

{
  return 1000000;
}

Assistant:

int64 time_freq()
{
#if defined(CONF_FAMILY_UNIX)
	return 1000000;
#elif defined(CONF_FAMILY_WINDOWS)
	int64 t;
	QueryPerformanceFrequency((PLARGE_INTEGER)&t);
	return t;
#else
	#error not implemented
#endif
}